

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForwardTypeRestrictionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypeRestrictionSyntax,slang::syntax::ForwardTypeRestrictionSyntax_const&>
          (BumpAllocator *this,ForwardTypeRestrictionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  ForwardTypeRestrictionSyntax *pFVar13;
  
  pFVar13 = (ForwardTypeRestrictionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForwardTypeRestrictionSyntax *)this->endPtr < pFVar13 + 1) {
    pFVar13 = (ForwardTypeRestrictionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pFVar13 + 1);
  }
  (pFVar13->keyword2).info = (args->keyword2).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->keyword1).kind;
  uVar8 = (args->keyword1).field_0x2;
  NVar9.raw = (args->keyword1).numFlags.raw;
  uVar10 = (args->keyword1).rawLen;
  TVar3 = (args->keyword2).kind;
  uVar4 = (args->keyword2).field_0x2;
  NVar5.raw = (args->keyword2).numFlags.raw;
  uVar6 = (args->keyword2).rawLen;
  (pFVar13->keyword1).info = (args->keyword1).info;
  (pFVar13->keyword2).kind = TVar3;
  (pFVar13->keyword2).field_0x2 = uVar4;
  (pFVar13->keyword2).numFlags = (NumericTokenFlags)NVar5.raw;
  (pFVar13->keyword2).rawLen = uVar6;
  (pFVar13->super_SyntaxNode).previewNode = pSVar2;
  (pFVar13->keyword1).kind = TVar7;
  (pFVar13->keyword1).field_0x2 = uVar8;
  (pFVar13->keyword1).numFlags = (NumericTokenFlags)NVar9.raw;
  (pFVar13->keyword1).rawLen = uVar10;
  (pFVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pFVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pFVar13->super_SyntaxNode).parent = pSVar1;
  return pFVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }